

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O3

HitWriter<Protein> * __thiscall
Alnout::Writer<Protein>::operator<<(Writer<Protein> *this,QueryHitsPair<Protein> *queryWithHits)

{
  ostream *poVar1;
  _Elt_pointer pHVar2;
  ulong uVar3;
  anon_struct_128_7_d437573b *paVar4;
  pointer pcVar5;
  char cVar6;
  unkuint9 Var7;
  unkuint9 Var8;
  char cVar9;
  ostream *poVar10;
  _Map_pointer ppaVar11;
  ulong uVar12;
  anon_struct_128_7_d437573b *paVar13;
  ulong *puVar14;
  Hit<Protein> *hit;
  _Elt_pointer pHVar15;
  char cVar16;
  _Elt_pointer paVar17;
  _Elt_pointer pHVar18;
  char cVar19;
  _Map_pointer ppHVar20;
  long lVar21;
  _Alloc_hider _Var22;
  bool bVar23;
  float fVar24;
  undefined1 local_240 [8];
  AlignmentLines lines;
  size_t numCols;
  string __str_7;
  size_type *local_1b8;
  string queryLen;
  string targetLen;
  string __str_6;
  size_t numMatches;
  size_t numGaps;
  _Map_pointer local_140;
  _Alloc_hider local_138;
  string tstrand;
  _Alloc_hider local_f8;
  undefined1 local_d8;
  undefined7 uStack_d7;
  string __str_2;
  _Alloc_hider local_98;
  size_type *local_78;
  string __str_5;
  _Elt_pointer local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  poVar1 = (this->super_HitWriter<Protein>).mOutput;
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Query >",7);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1,(queryWithHits->first).identifier._M_dataplus._M_p,
                       (queryWithHits->first).identifier._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," %Id   TLen  Target",0x13);
  cVar6 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  pHVar15 = (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pHVar2 = (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pHVar15 != pHVar2) {
    pHVar18 = (queryWithHits->second).
              super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppHVar20 = (queryWithHits->second).
               super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      lVar21 = *(long *)poVar1;
      *(undefined8 *)(poVar1 + *(long *)(lVar21 + -0x18) + 8) = 0;
      *(undefined8 *)(poVar1 + *(long *)(lVar21 + -0x18) + 0x10) = 3;
      fVar24 = Cigar::Identity(&pHVar15->alignment);
      poVar10 = std::ostream::_M_insert<double>((double)fVar24 * 100.0);
      local_d8 = 0x25;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,&stack0xffffffffffffff28,1);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 7;
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(pHVar15->target).identifier._M_dataplus._M_p,
                           (pHVar15->target).identifier._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pHVar15 = pHVar15 + 1;
      if (pHVar15 == pHVar18) {
        pHVar15 = ppHVar20[1];
        ppHVar20 = ppHVar20 + 1;
        pHVar18 = pHVar15 + 2;
      }
    } while (pHVar15 != pHVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  local_40 = (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  __str_7.field_2._8_8_ =
       (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_40 != (_Elt_pointer)__str_7.field_2._8_8_) {
    numGaps = (size_t)(queryWithHits->second).
                      super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>._M_impl.
                      super__Deque_impl_data._M_start._M_last;
    local_140 = (queryWithHits->second).
                super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
    do {
      uVar3 = (queryWithHits->first).sequence._M_string_length;
      cVar19 = '\x01';
      cVar16 = '\x01';
      if (9 < uVar3) {
        uVar12 = uVar3;
        cVar9 = '\x04';
        do {
          cVar16 = cVar9;
          if (uVar12 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0015afc1;
          }
          if (uVar12 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0015afc1;
          }
          if (uVar12 < 10000) goto LAB_0015afc1;
          bVar23 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar9 = cVar16 + '\x04';
        } while (bVar23);
        cVar16 = cVar16 + '\x01';
      }
LAB_0015afc1:
      local_1b8 = &queryLen._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_1b8,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_1b8,(uint)queryLen._M_dataplus._M_p,uVar3);
      uVar3 = (local_40->target).sequence._M_string_length;
      if (9 < uVar3) {
        uVar12 = uVar3;
        cVar16 = '\x04';
        do {
          cVar19 = cVar16;
          if (uVar12 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_0015b056;
          }
          if (uVar12 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_0015b056;
          }
          if (uVar12 < 10000) goto LAB_0015b056;
          bVar23 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar16 = cVar19 + '\x04';
        } while (bVar23);
        cVar19 = cVar19 + '\x01';
      }
LAB_0015b056:
      queryLen.field_2._8_8_ = &targetLen._M_string_length;
      std::__cxx11::string::_M_construct((ulong)((long)&queryLen.field_2 + 8),cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)queryLen.field_2._8_8_,(uint)targetLen._M_dataplus._M_p,uVar3);
      uVar3 = CONCAT44(queryLen._M_dataplus._M_p._4_4_,(uint)queryLen._M_dataplus._M_p);
      uVar12 = CONCAT44(targetLen._M_dataplus._M_p._4_4_,(uint)targetLen._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," Query",6);
      if (uVar12 < uVar3) {
        uVar12 = uVar3;
      }
      lVar21 = (long)((int)uVar12 + 1);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = lVar21;
      uVar3 = (queryWithHits->first).sequence._M_string_length;
      cVar16 = '\x01';
      if (9 < uVar3) {
        uVar12 = uVar3;
        cVar19 = '\x04';
        do {
          cVar16 = cVar19;
          if (uVar12 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0015b123;
          }
          if (uVar12 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0015b123;
          }
          if (uVar12 < 10000) goto LAB_0015b123;
          bVar23 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar19 = cVar16 + '\x04';
        } while (bVar23);
        cVar16 = cVar16 + '\x01';
      }
LAB_0015b123:
      _local_d8 = (pointer)&__str_2._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff28,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (_local_d8,(uint)__str_2._M_dataplus._M_p,uVar3);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,_local_d8,(long)__str_2._M_dataplus._M_p);
      local_138._M_p = (pointer)&tstrand._M_string_length;
      tstrand._M_string_length._0_2_ = 0x6161;
      tstrand._M_dataplus._M_p = (pointer)0x2;
      tstrand._M_string_length._2_1_ = 0;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_138._M_p,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," >",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(queryWithHits->first).identifier._M_dataplus._M_p,
                           (queryWithHits->first).identifier._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if ((size_type *)local_138._M_p != &tstrand._M_string_length) {
        operator_delete(local_138._M_p);
      }
      if ((size_type *)_local_d8 != &__str_2._M_string_length) {
        operator_delete(_local_d8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Target",6);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = lVar21;
      uVar3 = (local_40->target).sequence._M_string_length;
      cVar16 = '\x01';
      if (9 < uVar3) {
        uVar12 = uVar3;
        cVar19 = '\x04';
        do {
          cVar16 = cVar19;
          if (uVar12 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0015b2a6;
          }
          if (uVar12 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0015b2a6;
          }
          if (uVar12 < 10000) goto LAB_0015b2a6;
          bVar23 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar19 = cVar16 + '\x04';
        } while (bVar23);
        cVar16 = cVar16 + '\x01';
      }
LAB_0015b2a6:
      _local_d8 = (pointer)&__str_2._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff28,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (_local_d8,(uint)__str_2._M_dataplus._M_p,uVar3);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,_local_d8,(long)__str_2._M_dataplus._M_p);
      local_138._M_p = (pointer)&tstrand._M_string_length;
      tstrand._M_string_length._0_2_ = 0x6161;
      tstrand._M_dataplus._M_p = (pointer)0x2;
      tstrand._M_string_length._2_1_ = 0;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_138._M_p,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," >",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(local_40->target).identifier._M_dataplus._M_p,
                           (local_40->target).identifier._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if ((size_type *)local_138._M_p != &tstrand._M_string_length) {
        operator_delete(local_138._M_p);
      }
      if ((size_type *)_local_d8 != &__str_2._M_string_length) {
        operator_delete(_local_d8);
      }
      Sequence<Protein>::Sequence
                ((Sequence<Protein> *)&stack0xffffffffffffff28,&queryWithHits->first);
      Sequence<Protein>::Sequence((Sequence<Protein> *)&stack0xfffffffffffffec8,&local_40->target);
      ExtractAlignmentLines
                ((AlignmentLines *)local_240,(Sequence<Protein> *)&stack0xffffffffffffff28,
                 (Sequence<Protein> *)&stack0xfffffffffffffec8,&local_40->alignment,
                 (size_t *)
                 &lines.
                  super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,
                 (size_t *)(__str_6.field_2._M_local_buf + 8),&numMatches);
      if (local_f8._M_p != &stack0xffffffffffffff18) {
        operator_delete(local_f8._M_p);
      }
      if ((undefined1 *)tstrand.field_2._8_8_ != &stack0xfffffffffffffef8) {
        operator_delete((void *)tstrand.field_2._8_8_);
      }
      if ((size_type *)local_138._M_p != &tstrand._M_string_length) {
        operator_delete(local_138._M_p);
      }
      if (local_98._M_p != &stack0xffffffffffffff78) {
        operator_delete(local_98._M_p);
      }
      if ((undefined1 *)__str_2.field_2._8_8_ != &stack0xffffffffffffff58) {
        operator_delete((void *)__str_2.field_2._8_8_);
      }
      if ((size_type *)_local_d8 != &__str_2._M_string_length) {
        operator_delete(_local_d8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      __str_5.field_2._8_8_ =
           lines.
           super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Map_pointer)
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_map_size !=
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node) {
        local_38 = lines.
                   super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        local_48 = lines.
                   super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
        paVar17 = (_Elt_pointer)
                  lines.
                  super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
        do {
          ppaVar11 = lines.
                     super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node ==
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            ppaVar11 = (_Map_pointer)
                       (*(long *)((long)&lines.
                                         super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.
                                         field_2 + 8) + 0x200);
          }
          paVar4 = ppaVar11[-0x10];
          cVar16 = '\x01';
          if ((anon_struct_128_7_d437573b *)0x9 < paVar4) {
            paVar13 = paVar4;
            cVar19 = '\x04';
            do {
              cVar16 = cVar19;
              if (paVar13 < (anon_struct_128_7_d437573b *)0x64) {
                cVar16 = cVar16 + -2;
                goto LAB_0015b567;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x3e8) {
                cVar16 = cVar16 + -1;
                goto LAB_0015b567;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x2710) goto LAB_0015b567;
              bVar23 = (anon_struct_128_7_d437573b *)0x1869f < paVar13;
              paVar13 = (anon_struct_128_7_d437573b *)((ulong)paVar13 / 10000);
              cVar19 = cVar16 + '\x04';
            } while (bVar23);
            cVar16 = cVar16 + '\x01';
          }
LAB_0015b567:
          local_138._M_p = (pointer)&tstrand._M_string_length;
          std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffec8,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_138._M_p,(uint)tstrand._M_dataplus._M_p,(unsigned_long)paVar4);
          _Var22 = tstrand._M_dataplus;
          _local_d8 = tstrand._M_dataplus._M_p;
          ppaVar11 = lines.
                     super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node ==
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            ppaVar11 = (_Map_pointer)
                       (*(long *)((long)&lines.
                                         super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.
                                         field_2 + 8) + 0x200);
          }
          paVar4 = ppaVar11[-10];
          cVar16 = '\x01';
          if ((anon_struct_128_7_d437573b *)0x9 < paVar4) {
            paVar13 = paVar4;
            cVar19 = '\x04';
            do {
              cVar16 = cVar19;
              if (paVar13 < (anon_struct_128_7_d437573b *)0x64) {
                cVar16 = cVar16 + -2;
                goto LAB_0015b629;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x3e8) {
                cVar16 = cVar16 + -1;
                goto LAB_0015b629;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x2710) goto LAB_0015b629;
              bVar23 = (anon_struct_128_7_d437573b *)0x1869f < paVar13;
              paVar13 = (anon_struct_128_7_d437573b *)((ulong)paVar13 / 10000);
              cVar19 = cVar16 + '\x04';
            } while (bVar23);
            cVar16 = cVar16 + '\x01';
          }
LAB_0015b629:
          local_78 = &__str_5._M_string_length;
          std::__cxx11::string::_M_construct((ulong)&local_78,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_78,(uint)__str_5._M_dataplus._M_p,(unsigned_long)paVar4);
          ppaVar11 = lines.
                     super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node ==
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            ppaVar11 = (_Map_pointer)
                       (*(long *)((long)&lines.
                                         super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.
                                         field_2 + 8) + 0x200);
          }
          paVar4 = ppaVar11[-0xf];
          cVar16 = '\x01';
          if ((anon_struct_128_7_d437573b *)0x9 < paVar4) {
            paVar13 = paVar4;
            cVar19 = '\x04';
            do {
              cVar16 = cVar19;
              if (paVar13 < (anon_struct_128_7_d437573b *)0x64) {
                cVar16 = cVar16 + -2;
                goto LAB_0015b6d9;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x3e8) {
                cVar16 = cVar16 + -1;
                goto LAB_0015b6d9;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x2710) goto LAB_0015b6d9;
              bVar23 = (anon_struct_128_7_d437573b *)0x1869f < paVar13;
              paVar13 = (anon_struct_128_7_d437573b *)((ulong)paVar13 / 10000);
              cVar19 = cVar16 + '\x04';
            } while (bVar23);
            cVar16 = cVar16 + '\x01';
          }
LAB_0015b6d9:
          targetLen.field_2._8_8_ = &__str_6._M_string_length;
          std::__cxx11::string::_M_construct((ulong)((long)&targetLen.field_2 + 8),cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)targetLen.field_2._8_8_,(uint)__str_6._M_dataplus._M_p,
                     (unsigned_long)paVar4);
          __str_2._M_string_length =
               CONCAT44(__str_6._M_dataplus._M_p._4_4_,(uint)__str_6._M_dataplus._M_p);
          ppaVar11 = lines.
                     super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node ==
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            ppaVar11 = (_Map_pointer)
                       (*(long *)((long)&lines.
                                         super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.
                                         field_2 + 8) + 0x200);
          }
          paVar4 = ppaVar11[-9];
          cVar16 = '\x01';
          if ((anon_struct_128_7_d437573b *)0x9 < paVar4) {
            paVar13 = paVar4;
            cVar19 = '\x04';
            do {
              cVar16 = cVar19;
              if (paVar13 < (anon_struct_128_7_d437573b *)0x64) {
                cVar16 = cVar16 + -2;
                goto LAB_0015b79b;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x3e8) {
                cVar16 = cVar16 + -1;
                goto LAB_0015b79b;
              }
              if (paVar13 < (anon_struct_128_7_d437573b *)0x2710) goto LAB_0015b79b;
              bVar23 = (anon_struct_128_7_d437573b *)0x1869f < paVar13;
              paVar13 = (anon_struct_128_7_d437573b *)((ulong)paVar13 / 10000);
              cVar19 = cVar16 + '\x04';
            } while (bVar23);
            cVar16 = cVar16 + '\x01';
          }
LAB_0015b79b:
          numCols = (size_t)&__str_7._M_string_length;
          std::__cxx11::string::_M_construct((ulong)&numCols,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)numCols,(uint)__str_7._M_dataplus._M_p,(unsigned_long)paVar4);
          lVar21 = 8;
          puVar14 = (ulong *)&stack0xffffffffffffff28;
          do {
            pcVar5 = *(pointer *)(&stack0xffffffffffffff28 + lVar21);
            bVar23 = _Var22._M_p < pcVar5;
            if (_Var22._M_p <= pcVar5) {
              _Var22._M_p = pcVar5;
            }
            if (bVar23) {
              puVar14 = (ulong *)(&stack0xffffffffffffff28 + lVar21);
            }
            lVar21 = lVar21 + 8;
          } while (lVar21 != 0x20);
          uVar3 = *puVar14;
          if ((size_type *)numCols != &__str_7._M_string_length) {
            operator_delete((void *)numCols);
          }
          if ((size_type *)targetLen.field_2._8_8_ != &__str_6._M_string_length) {
            operator_delete((void *)targetLen.field_2._8_8_);
          }
          if (local_78 != &__str_5._M_string_length) {
            operator_delete(local_78);
          }
          if ((size_type *)local_138._M_p != &tstrand._M_string_length) {
            operator_delete(local_138._M_p);
          }
          _local_d8 = (pointer)&__str_2._M_string_length;
          __str_2._M_dataplus._M_p = (pointer)0x0;
          __str_2._M_string_length = __str_2._M_string_length & 0xffffffffffffff00;
          local_138._M_p = (pointer)&tstrand._M_string_length;
          tstrand._M_dataplus._M_p = (pointer)0x0;
          tstrand._M_string_length._0_2_ = (ushort)tstrand._M_string_length & 0xff00;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Qry ",4);
          lVar21 = (long)(int)uVar3;
          *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = lVar21;
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,_local_d8,(long)__str_2._M_dataplus._M_p);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(paVar17->q)._M_dataplus._M_p,(paVar17->q)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          local_78 = &__str_5._M_string_length;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_78,(char)__str_2._M_dataplus._M_p + (char)uVar3 + '\x05');
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar1,(char *)local_78,
                               CONCAT44(__str_5._M_dataplus._M_p._4_4_,
                                        (uint)__str_5._M_dataplus._M_p));
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(paVar17->a)._M_dataplus._M_p,(paVar17->a)._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if (local_78 != &__str_5._M_string_length) {
            operator_delete(local_78);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Tgt ",4);
          *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = lVar21;
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_138._M_p,(long)tstrand._M_dataplus._M_p);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(paVar17->t)._M_dataplus._M_p,(paVar17->t)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          if ((size_type *)local_138._M_p != &tstrand._M_string_length) {
            operator_delete(local_138._M_p);
          }
          if ((size_type *)_local_d8 != &__str_2._M_string_length) {
            operator_delete(_local_d8);
          }
          paVar17 = paVar17 + 1;
          if (paVar17 == local_38) {
            paVar17 = (_Elt_pointer)local_48->qe;
            local_48 = (_Elt_pointer)&local_48->qe;
            local_38 = paVar17 + 4;
          }
        } while (paVar17 != (_Elt_pointer)__str_5.field_2._8_8_);
      }
      __str_5.field_2._8_4_ = (float)(ulong)__str_6.field_2._8_8_;
      Var7 = ZEXT89(lines.
                    super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
      Var8 = (unkuint9)numMatches;
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," cols, ",7);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ids (",6);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 8) = 1;
      poVar10 = std::ostream::_M_insert<double>
                          ((double)(((float)__str_5.field_2._8_4_ / (float)(unkint9)Var7) * 100.0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"%), ",4);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," gaps (",7);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 8) = 1;
      poVar10 = std::ostream::_M_insert<double>
                          ((double)(((float)(unkint9)Var8 / (float)(unkint9)Var7) * 100.0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"%)",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      std::
      deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
      ::~deque((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                *)local_240);
      if ((size_type *)queryLen.field_2._8_8_ != &targetLen._M_string_length) {
        operator_delete((void *)queryLen.field_2._8_8_);
      }
      if (local_1b8 != &queryLen._M_string_length) {
        operator_delete(local_1b8);
      }
      local_40 = local_40 + 1;
      if (local_40 == (_Elt_pointer)numGaps) {
        local_40 = local_140[1];
        local_140 = local_140 + 1;
        numGaps = (size_t)(local_40 + 2);
      }
    } while (local_40 != (_Elt_pointer)__str_7.field_2._8_8_);
  }
  return &this->super_HitWriter<Protein>;
}

Assistant:

HitWriter< Alphabet >&
  operator<<( const QueryHitsPair< Alphabet >& queryWithHits ) {
    const auto& query = queryWithHits.first;
    const auto& hits  = queryWithHits.second;

    auto& out = this->mOutput;

    // Output with fixed precision (sticky)
    out << std::setiosflags( std::ios::fixed );

    out << "Query >" << query.identifier << std::endl;
    out << " %Id   TLen  Target" << std::endl;
    for( auto& hit : hits ) {
      out << std::setprecision( 0 ) << std::setw( 3 )
              << ( hit.alignment.Identity() * 100.0 ) << '%' << std::setw( 7 )
              << hit.target.Length() << "  " << hit.target.identifier
              << std::endl;
    }
    out << std::endl;

    for( const auto& hit : hits ) {
      auto queryLen  = std::to_string( query.Length() );
      auto targetLen = std::to_string( hit.target.Length() );
      auto maxLen    = std::max( queryLen.size(), targetLen.size() );

      out << " Query" << std::setw( maxLen + 1 )
              << std::to_string( query.Length() ) << Unit() << " >"
              << query.identifier << std::endl;
      out << "Target" << std::setw( maxLen + 1 )
              << std::to_string( hit.target.Length() ) << Unit() << " >"
              << hit.target.identifier << std::endl;

      size_t numCols, numMatches, numGaps;
      auto   lines = ExtractAlignmentLines(
        QueryForAlignment( hit, query ), TargetForAlignment( hit, query ), hit.alignment,
        &numCols, &numMatches, &numGaps );

      out << std::endl;
      for( auto& line : lines ) {
        auto padLen = std::max( { std::to_string( lines.back().qs ).size(),
                                  std::to_string( lines.back().ts ).size(),
                                  std::to_string( lines.back().qe ).size(),
                                  std::to_string( lines.back().te ).size() } );

        auto qstrand = QueryStrand( hit );
        auto tstrand = TargetStrand( hit );

        if( !qstrand.empty() )
          qstrand += " ";

        if( !tstrand.empty() )
          tstrand += " ";

        out << "Qry " << std::setw( padLen )
                << QueryPos( line.qs, query, hit )
                << " " << qstrand << line.q << " "
                << QueryPos( line.qe, query, hit ) << std::endl;

        out << std::string( 5 + padLen + qstrand.size(), ' ' ) << line.a
                << std::endl;

        out << "Tgt " << std::setw( padLen )
                << TargetPos( line.ts, query, hit )
                << " " << tstrand << line.t << " "
                << TargetPos( line.te, query, hit ) << std::endl;

        out << std::endl;
      }

      float identity  = float( numMatches ) / float( numCols );
      float gapsRatio = float( numGaps ) / float( numCols );
      out << numCols << " cols, " << numMatches << " ids ("
              << std::setprecision( 1 ) << ( 100.0f * identity ) << "%), "
              << numGaps << " gaps (" << std::setprecision( 1 )
              << ( 100.0f * gapsRatio ) << "%)" << std::endl;

      out << std::endl;
    }
    return *this;
  }